

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void Imf_3_3::anon_unknown_1::copyCompressionRecord(Header *dst,Header *src)

{
  float fVar1;
  bool bVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  iterator __position;
  undefined8 in_RSI;
  iterator i;
  lock_guard<std::mutex> lk;
  CompressionStash *s;
  map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
  *in_stack_ffffffffffffff58;
  map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
  *in_stack_ffffffffffffff60;
  _Self in_stack_ffffffffffffff98;
  map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
  *in_stack_ffffffffffffffa0;
  _Self local_48 [3];
  undefined8 local_30;
  _Self local_28 [2];
  CompressionStash *local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_18 = getStash();
  if (local_18 != (CompressionStash *)0x0) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,
               (mutex_type *)in_stack_ffffffffffffff58);
    local_30 = local_10;
    local_28[0]._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
         ::find(in_stack_ffffffffffffff58,(key_type *)0x2fb07b);
    local_48[0]._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar2 = std::operator!=(local_28,local_48);
    if (bVar2) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>
                             *)0x2fb0ca);
      pmVar4 = std::
               map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
               ::operator[](in_stack_ffffffffffffffa0,(key_type *)in_stack_ffffffffffffff98._M_node)
      ;
      fVar1 = (ppVar3->second).dwa_level;
      pmVar4->zip_level = (ppVar3->second).zip_level;
      pmVar4->dwa_level = fVar1;
    }
    else {
      __position = std::
                   map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
                   ::find(in_stack_ffffffffffffff58,(key_type *)0x2fb155);
      local_28[0]._M_node = __position._M_node;
      std::
      map<const_void_*,_Imf_3_3::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_3::(anonymous_namespace)::CompressionRecord>_>_>
      ::end(in_stack_ffffffffffffff58);
      bVar2 = std::operator!=(local_28,(_Self *)&stack0xffffffffffffff98);
      if (bVar2) {
        std::
        map<void_const*,Imf_3_3::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_3::(anonymous_namespace)::CompressionRecord>>>
        ::erase_abi_cxx11_(in_stack_ffffffffffffff60,__position);
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2fb1e4);
  }
  return;
}

Assistant:

static void
copyCompressionRecord (Header* dst, const Header* src)
{
    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (src);
        if (i != s->_store.end ()) { s->_store[dst] = i->second; }
        else
        {
            i = s->_store.find (dst);
            if (i != s->_store.end ()) s->_store.erase (i);
        }
    }
}